

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::testGroupEnded(XmlReporter *this,TestGroupStats *testGroupStats)

{
  XmlWriter *this_00;
  ScopedElement *this_01;
  long in_RDI;
  TestGroupStats *in_stack_fffffffffffffdf8;
  StreamingReporterBase<Catch::XmlReporter> *in_stack_fffffffffffffe00;
  string *in_stack_fffffffffffffe08;
  string *name;
  ScopedElement *in_stack_fffffffffffffe10;
  undefined8 in_stack_fffffffffffffe18;
  XmlFormatting XVar2;
  allocator *paVar1;
  string *in_stack_fffffffffffffe20;
  XmlWriter *in_stack_fffffffffffffe28;
  undefined1 local_179 [40];
  allocator local_151;
  string local_150 [39];
  allocator local_129;
  string local_128 [39];
  allocator local_101;
  string local_100 [55];
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [64];
  
  XVar2 = (XmlFormatting)((ulong)in_stack_fffffffffffffe18 >> 0x20);
  StreamingReporterBase<Catch::XmlReporter>::testGroupEnded
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"OverallResults",&local_41);
  operator|(Newline,Indent);
  XmlWriter::scopedElement(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,XVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"successes",&local_79);
  XmlWriter::ScopedElement::writeAttribute<unsigned_long>
            (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
             (unsigned_long *)in_stack_fffffffffffffe00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"failures",&local_a1);
  XmlWriter::ScopedElement::writeAttribute<unsigned_long>
            (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
             (unsigned_long *)in_stack_fffffffffffffe00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"expectedFailures",&local_c9);
  XmlWriter::ScopedElement::writeAttribute<unsigned_long>
            (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
             (unsigned_long *)in_stack_fffffffffffffe00);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffe00);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  this_00 = (XmlWriter *)(in_RDI + 0x170);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"OverallResultsCases",&local_101);
  operator|(Newline,Indent);
  XmlWriter::scopedElement(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,XVar2);
  paVar1 = &local_129;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_128,"successes",paVar1);
  XVar2 = (XmlFormatting)((ulong)paVar1 >> 0x20);
  XmlWriter::ScopedElement::writeAttribute<unsigned_long>
            (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
             (unsigned_long *)in_stack_fffffffffffffe00);
  paVar1 = &local_151;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,"failures",paVar1);
  this_01 = XmlWriter::ScopedElement::writeAttribute<unsigned_long>
                      (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                       (unsigned_long *)in_stack_fffffffffffffe00);
  name = (string *)local_179;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_179 + 1),"expectedFailures",(allocator *)name);
  XmlWriter::ScopedElement::writeAttribute<unsigned_long>
            (this_01,name,(unsigned_long *)in_stack_fffffffffffffe00);
  std::__cxx11::string::~string((string *)(local_179 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_179);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffe00);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  operator|(Newline,Indent);
  XmlWriter::endElement(this_00,XVar2);
  return;
}

Assistant:

void XmlReporter::testGroupEnded( TestGroupStats const& testGroupStats ) {
        StreamingReporterBase::testGroupEnded( testGroupStats );
        // TODO: Check testGroupStats.aborting and act accordingly.
        m_xml.scopedElement( "OverallResults" )
            .writeAttribute( "successes", testGroupStats.totals.assertions.passed )
            .writeAttribute( "failures", testGroupStats.totals.assertions.failed )
            .writeAttribute( "expectedFailures", testGroupStats.totals.assertions.failedButOk );
        m_xml.scopedElement( "OverallResultsCases")
            .writeAttribute( "successes", testGroupStats.totals.testCases.passed )
            .writeAttribute( "failures", testGroupStats.totals.testCases.failed )
            .writeAttribute( "expectedFailures", testGroupStats.totals.testCases.failedButOk );
        m_xml.endElement();
    }